

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

ExecState __thiscall
Process::startInternal
          (Process *this,Path *command,List<String> *a,List<String> *environment,int timeout,
          uint execFlags)

{
  String *this_00;
  pointer pSVar1;
  element_type *peVar2;
  bool bVar3;
  uint __i;
  int iVar4;
  __pid_t _Var5;
  uint uVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  char **__argv;
  char **__envp;
  char **ppcVar11;
  ssize_t sVar12;
  pointer pSVar13;
  int iVar14;
  const_iterator it;
  timeval *__timeout;
  char *pcVar15;
  ulong uVar16;
  ExecState EVar17;
  pointer pSVar18;
  long lVar19;
  int closePipe [2];
  SharedPtr loop;
  timeval timeoutForSelect;
  fd_set rfds;
  List<String> arguments;
  timeval now;
  timeval started;
  Path cmd;
  char c;
  __fd_mask local_a8;
  _Head_base<0UL,_Process_*,_false> local_a0;
  
  (this->mErrorString).mString._M_string_length = 0;
  this_00 = &this->mErrorString;
  *(this->mErrorString).mString._M_dataplus._M_p = '\0';
  pSVar1 = (environment->super_vector<String,_std::allocator<String>_>).
           super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pcVar15 = (char *)0x0;
  for (pSVar18 = (environment->super_vector<String,_std::allocator<String>_>).
                 super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data
                 ._M_start; pSVar18 != pSVar1; pSVar18 = pSVar18 + 1) {
    bVar3 = String::startsWith(pSVar18,"PATH=",0xffffffffffffffff,CaseSensitive);
    if (bVar3) {
      pcVar15 = (pSVar18->mString)._M_dataplus._M_p + 5;
      break;
    }
  }
  findCommand(&cmd,&command->super_String,pcVar15);
  if (cmd.super_String.mString._M_string_length == 0) {
    String::String((String *)&rfds,"Command not found",0xffffffffffffffff);
    std::__cxx11::string::operator=((string *)this_00,(string *)&rfds);
    std::__cxx11::string::~string((string *)&rfds);
    EVar17 = Error;
    goto LAB_001903d4;
  }
  std::vector<String,_std::allocator<String>_>::vector
            (&arguments.super_vector<String,_std::allocator<String>_>,
             &a->super_vector<String,_std::allocator<String>_>);
  do {
    iVar4 = pipe(closePipe);
    if (iVar4 != -1) break;
    piVar7 = __errno_location();
  } while (*piVar7 == 4);
  bVar3 = SocketClient::setFlags(closePipe[1],1,1,2,FlagAppend);
  if (bVar3) {
    piVar7 = this->mStdIn;
    do {
      iVar4 = pipe(piVar7);
      if (iVar4 != -1) break;
      piVar8 = __errno_location();
    } while (*piVar8 == 4);
    piVar8 = this->mStdOut;
    do {
      iVar4 = pipe(piVar8);
      if (iVar4 != -1) break;
      piVar9 = __errno_location();
    } while (*piVar9 == 4);
    piVar9 = this->mStdErr;
    do {
      iVar4 = pipe(piVar9);
      if (iVar4 != -1) break;
      piVar10 = __errno_location();
    } while (*piVar10 == 4);
    if (this->mMode == Sync) {
      do {
        iVar4 = pipe(this->mSync);
        if (iVar4 != -1) break;
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
    }
    lVar19 = (long)arguments.super_vector<String,_std::allocator<String>_>.
                   super__Vector_base<String,_std::allocator<String>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)arguments.super_vector<String,_std::allocator<String>_>.
                   super__Vector_base<String,_std::allocator<String>_>._M_impl.
                   super__Vector_impl_data._M_start >> 5;
    __argv = (char **)operator_new__(-(ulong)(lVar19 + 2U >> 0x3d != 0) | lVar19 * 8 + 0x10U);
    __argv[lVar19 + 1] = (char *)0x0;
    *__argv = cmd.super_String.mString._M_dataplus._M_p;
    ppcVar11 = __argv;
    for (; ppcVar11 = ppcVar11 + 1,
        arguments.super_vector<String,_std::allocator<String>_>.
        super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data._M_start
        != arguments.super_vector<String,_std::allocator<String>_>.
           super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
           _M_finish;
        arguments.super_vector<String,_std::allocator<String>_>.
        super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data._M_start
             = arguments.super_vector<String,_std::allocator<String>_>.
               super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
               _M_start + 1) {
      *ppcVar11 = ((arguments.super_vector<String,_std::allocator<String>_>.
                    super__Vector_base<String,_std::allocator<String>_>._M_impl.
                    super__Vector_impl_data._M_start)->mString)._M_dataplus._M_p;
    }
    pSVar18 = (environment->super_vector<String,_std::allocator<String>_>).
              super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
              _M_start;
    pSVar1 = (environment->super_vector<String,_std::allocator<String>_>).
             super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    lVar19 = (long)pSVar1 - (long)pSVar18 >> 5;
    uVar16 = lVar19 * 8 + 8;
    if (0x1fffffffffffffff < lVar19 + 1U) {
      uVar16 = 0xffffffffffffffff;
    }
    __envp = (char **)operator_new__(uVar16);
    __envp[lVar19] = (char *)0x0;
    ppcVar11 = __envp;
    pSVar13 = pSVar18;
    if (pSVar18 != pSVar1) {
      for (; pSVar13 != pSVar1; pSVar13 = pSVar13 + 1) {
        *ppcVar11 = (pSVar13->mString)._M_dataplus._M_p;
        ppcVar11 = ppcVar11 + 1;
      }
    }
    EVar17 = Done;
    ProcessThread::setPending(1);
    _Var5 = fork();
    this->mPid = _Var5;
    if (_Var5 == -1) {
      ProcessThread::setPending(-1);
      do {
        iVar4 = close(this->mStdIn[1]);
        if (iVar4 != -1) break;
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      do {
        iVar4 = close(*piVar7);
        if (iVar4 != -1) break;
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      do {
        iVar4 = close(this->mStdOut[1]);
        if (iVar4 != -1) break;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      do {
        iVar4 = close(*piVar8);
        if (iVar4 != -1) break;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      do {
        iVar4 = close(this->mStdErr[1]);
        if (iVar4 != -1) break;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      do {
        iVar4 = close(*piVar9);
        if (iVar4 != -1) break;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      do {
        iVar4 = close(closePipe[1]);
        if (iVar4 != -1) break;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      do {
        iVar4 = close(closePipe[0]);
        if (iVar4 != -1) break;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      String::String((String *)&rfds,"Fork failed",0xffffffffffffffff);
      std::__cxx11::string::operator=((string *)this_00,(string *)&rfds);
      std::__cxx11::string::~string((string *)&rfds);
      operator_delete__(__envp);
      operator_delete__(__argv);
    }
    else {
      if (_Var5 == 0) {
        do {
          iVar4 = close(closePipe[0]);
          if (iVar4 != -1) break;
          piVar10 = __errno_location();
        } while (*piVar10 == 4);
        do {
          iVar4 = close(this->mStdIn[1]);
          if (iVar4 != -1) break;
          piVar10 = __errno_location();
        } while (*piVar10 == 4);
        do {
          iVar4 = close(*piVar8);
          if (iVar4 != -1) break;
          piVar10 = __errno_location();
        } while (*piVar10 == 4);
        do {
          iVar4 = close(*piVar9);
          if (iVar4 != -1) break;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
        do {
          iVar4 = close(0);
          if (iVar4 != -1) break;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
        do {
          iVar4 = close(1);
          if (iVar4 != -1) break;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
        do {
          iVar4 = close(2);
          if (iVar4 != -1) break;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
        do {
          iVar4 = dup2(*piVar7,0);
          if (iVar4 != -1) break;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
        do {
          iVar4 = close(*piVar7);
          if (iVar4 != -1) break;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
        do {
          iVar4 = dup2(this->mStdOut[1],1);
          if (iVar4 != -1) break;
          piVar7 = __errno_location();
        } while (*piVar7 == 4);
        do {
          iVar4 = close(this->mStdOut[1]);
          if (iVar4 != -1) break;
          piVar7 = __errno_location();
        } while (*piVar7 == 4);
        do {
          iVar4 = dup2(this->mStdErr[1],2);
          if (iVar4 != -1) break;
          piVar7 = __errno_location();
        } while (*piVar7 == 4);
        do {
          iVar4 = close(this->mStdErr[1]);
          if (iVar4 != -1) break;
          piVar7 = __errno_location();
        } while (*piVar7 == 4);
        if ((((this->mChRoot).super_String.mString._M_string_length == 0) ||
            (iVar4 = chroot((this->mChRoot).super_String.mString._M_dataplus._M_p), iVar4 == 0)) &&
           (((this->mCwd).super_String.mString._M_string_length == 0 ||
            (iVar4 = chdir((this->mCwd).super_String.mString._M_dataplus._M_p), iVar4 == 0)))) {
          if (pSVar18 == pSVar1) {
            execv(cmd.super_String.mString._M_dataplus._M_p,__argv);
          }
          else {
            execve(cmd.super_String.mString._M_dataplus._M_p,__argv,__envp);
          }
        }
        rfds.fds_bits[0]._0_1_ = 99;
        do {
          sVar12 = ::write(closePipe[1],&rfds,1);
          if ((int)sVar12 != -1) break;
          piVar7 = __errno_location();
        } while (*piVar7 == 4);
        do {
          iVar4 = close(closePipe[1]);
          if (iVar4 != -1) break;
          piVar7 = __errno_location();
        } while (*piVar7 == 4);
        _exit(1);
      }
      operator_delete__(__envp);
      operator_delete__(__argv);
      do {
        iVar4 = close(closePipe[1]);
        if (iVar4 != -1) break;
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      do {
        iVar4 = close(*piVar7);
        if (iVar4 != -1) break;
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      do {
        iVar4 = close(this->mStdOut[1]);
        if (iVar4 != -1) break;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      do {
        iVar4 = close(this->mStdErr[1]);
        if (iVar4 != -1) break;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      do {
        uVar6 = fcntl(this->mStdIn[1],3,0);
        if (uVar6 != 0xffffffff) break;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      uVar6 = uVar6 | 0x800;
      do {
        iVar4 = fcntl(this->mStdIn[1],4,(ulong)uVar6);
        if (iVar4 != -1) break;
        piVar7 = __errno_location();
        uVar6 = 0xffffffff;
      } while (*piVar7 == 4);
      do {
        uVar6 = fcntl(*piVar8,3,0);
        if (uVar6 != 0xffffffff) break;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      uVar6 = uVar6 | 0x800;
      do {
        iVar4 = fcntl(*piVar8,4,(ulong)uVar6);
        if (iVar4 != -1) break;
        piVar7 = __errno_location();
        uVar6 = 0xffffffff;
      } while (*piVar7 == 4);
      do {
        uVar6 = fcntl(*piVar9,3,0);
        if (uVar6 != 0xffffffff) break;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      uVar6 = uVar6 | 0x800;
      do {
        iVar4 = fcntl(*piVar9,4,(ulong)uVar6);
        if (iVar4 != -1) break;
        piVar7 = __errno_location();
        uVar6 = 0xffffffff;
      } while (*piVar7 == 4);
      do {
        sVar12 = read(closePipe[0],&c,1);
        iVar4 = (int)sVar12;
        if (iVar4 != -1) {
          if (iVar4 == 0) goto LAB_0018ff69;
          if (iVar4 != 1) goto LAB_0018ff77;
          goto LAB_0018fef8;
        }
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      do {
        iVar4 = close(closePipe[0]);
        if (iVar4 != -1) break;
      } while (*piVar7 == 4);
      String::String((String *)&rfds,"Failed to read from closePipe during process start",
                     0xffffffffffffffff);
      std::__cxx11::string::operator=((string *)this_00,(string *)&rfds);
      std::__cxx11::string::~string((string *)&rfds);
      this->mPid = -1;
      ProcessThread::setPending(-1);
      this->mReturn = -1;
    }
    goto LAB_001903c4;
  }
  String::String((String *)&rfds,"Unable to set FD_CLOEXEC",0xffffffffffffffff);
  std::__cxx11::string::operator=((string *)this_00,(string *)&rfds);
  std::__cxx11::string::~string((string *)&rfds);
  do {
    iVar4 = close(closePipe[0]);
    if (iVar4 != -1) break;
    piVar7 = __errno_location();
  } while (*piVar7 == 4);
  EVar17 = Error;
  do {
    iVar4 = close(closePipe[1]);
    if (iVar4 != -1) break;
    piVar7 = __errno_location();
  } while (*piVar7 == 4);
  goto LAB_001903c7;
  while (piVar7 = __errno_location(), *piVar7 == 4) {
LAB_0018fef8:
    iVar4 = close(closePipe[0]);
    if (iVar4 != -1) break;
  }
  String::String((String *)&rfds,"Process failed to start",0xffffffffffffffff);
  std::__cxx11::string::operator=((string *)this_00,(string *)&rfds);
  std::__cxx11::string::~string((string *)&rfds);
  this->mReturn = -1;
  this->mPid = -1;
  ProcessThread::setPending(-1);
LAB_001903c4:
  EVar17 = Error;
  goto LAB_001903c7;
  while (piVar7 = __errno_location(), *piVar7 == 4) {
LAB_0018ff69:
    iVar4 = close(closePipe[0]);
    if (iVar4 != -1) break;
  }
LAB_0018ff77:
  ProcessThread::addPid(this->mPid,this,this->mMode == Async);
  if (this->mMode == Async) {
    EventLoop::eventLoop();
    peVar2 = loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
       ) {
      iVar4 = this->mStdOut[0];
      _c = processCallback;
      local_a8 = 0;
      local_a0._M_head_impl = this;
      std::function<void(int,unsigned_int)>::
      function<std::_Bind<void(Process::*(Process*,std::_Placeholder<1>,std::_Placeholder<2>))(int,int)>,void>
                ((function<void(int,unsigned_int)> *)&rfds,
                 (_Bind<void_(Process::*(Process_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>
                  *)&c);
      EventLoop::registerSocket(peVar2,iVar4,1,(function<void_(int,_unsigned_int)> *)&rfds);
      std::_Function_base::~_Function_base((_Function_base *)&rfds);
      peVar2 = loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar4 = this->mStdErr[0];
      _c = processCallback;
      local_a8 = 0;
      local_a0._M_head_impl = this;
      std::function<void(int,unsigned_int)>::
      function<std::_Bind<void(Process::*(Process*,std::_Placeholder<1>,std::_Placeholder<2>))(int,int)>,void>
                ((function<void(int,unsigned_int)> *)&rfds,
                 (_Bind<void_(Process::*(Process_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>
                  *)&c);
      EventLoop::registerSocket(peVar2,iVar4,1,(function<void_(int,_unsigned_int)> *)&rfds);
      std::_Function_base::~_Function_base((_Function_base *)&rfds);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    if (0 < timeout) {
      Rct::gettime(&started);
      timeoutForSelect.tv_sec = (ulong)(uint)timeout / 1000;
      timeoutForSelect.tv_usec = (__suseconds_t)(((uint)timeout % 1000) * 1000);
    }
    if ((execFlags & 1) == 0) {
      closeStdIn(this,CloseForce);
      this->mWantStdInClosed = false;
    }
    __timeout = (timeval *)&timeoutForSelect;
    if (timeout < 1) {
      __timeout = (timeval *)0x0;
    }
    while( true ) {
      for (lVar19 = 0; lVar19 != 0x10; lVar19 = lVar19 + 1) {
        rfds.fds_bits[lVar19] = 0;
      }
      for (lVar19 = 0; lVar19 != 0x10; lVar19 = lVar19 + 1) {
        pcVar15 = &c + lVar19 * 8;
        pcVar15[0] = '\0';
        pcVar15[1] = '\0';
        pcVar15[2] = '\0';
        pcVar15[3] = '\0';
        pcVar15[4] = '\0';
        pcVar15[5] = '\0';
        pcVar15[6] = '\0';
        pcVar15[7] = '\0';
      }
      iVar4 = this->mStdOut[0];
      rfds.fds_bits[iVar4 / 0x40] = rfds.fds_bits[iVar4 / 0x40] | 1L << ((byte)iVar4 & 0x3f);
      iVar14 = this->mStdErr[0];
      rfds.fds_bits[iVar14 / 0x40] = rfds.fds_bits[iVar14 / 0x40] | 1L << ((byte)iVar14 & 0x3f);
      if (iVar14 < iVar4) {
        iVar14 = iVar4;
      }
      iVar4 = this->mSync[0];
      rfds.fds_bits[iVar4 / 0x40] = rfds.fds_bits[iVar4 / 0x40] | 1L << ((byte)iVar4 & 0x3f);
      if (iVar14 <= iVar4) {
        iVar14 = iVar4;
      }
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      iVar4 = this->mStdIn[1];
      if ((iVar4 != -1) &&
         (*(ulong *)(&c + (long)(iVar4 / 0x40) * 8) =
               *(ulong *)(&c + (long)(iVar4 / 0x40) * 8) | 1L << ((byte)iVar4 & 0x3f),
         iVar14 <= iVar4)) {
        iVar14 = iVar4;
      }
      while (iVar4 = select(iVar14 + 1,(fd_set *)&rfds,(fd_set *)&c,(fd_set *)0x0,__timeout),
            iVar4 == -1) {
        piVar7 = __errno_location();
        if (*piVar7 != 4) {
          String::String((String *)&loop,"Sync select failed: ",0xffffffffffffffff);
          std::__cxx11::string::operator=((string *)this_00,(string *)&loop);
          std::__cxx11::string::~string((string *)&loop);
          Rct::strerror((Rct *)&loop,*piVar7);
          std::__cxx11::string::append((string *)this_00);
          std::__cxx11::string::~string((string *)&loop);
          goto LAB_001903c4;
        }
      }
      iVar4 = *piVar8;
      if (((ulong)rfds.fds_bits[iVar4 / 0x40] >> ((long)iVar4 % 0x40 & 0x3fU) & 1) != 0) {
        handleOutput(this,iVar4,&this->mStdOutBuffer,&this->mStdOutIndex,&this->mReadyReadStdOut);
      }
      iVar4 = *piVar9;
      if (((ulong)rfds.fds_bits[iVar4 / 0x40] >> ((long)iVar4 % 0x40 & 0x3fU) & 1) != 0) {
        handleOutput(this,iVar4,&this->mStdErrBuffer,&this->mStdErrIndex,&this->mReadyReadStdErr);
      }
      iVar4 = this->mStdIn[1];
      if ((iVar4 != -1) &&
         ((*(ulong *)(&c + (long)(iVar4 / 0x40) * 8) >> ((long)iVar4 % 0x40 & 0x3fU) & 1) != 0)) {
        handleInput(this,iVar4);
      }
      if (((ulong)rfds.fds_bits[this->mSync[0] / 0x40] >> ((long)this->mSync[0] % 0x40 & 0x3fU) & 1)
          != 0) break;
      if (timeout != 0) {
        Rct::gettime(&now);
        iVar14 = (int)(started.tv_usec / -1000) +
                 (int)started.tv_sec * -1000 + (int)now.tv_sec * 1000 + (int)(now.tv_usec / 1000);
        iVar4 = timeout - iVar14;
        if (iVar4 == 0 || timeout < iVar14) {
          kill(this,0xf,iVar14);
          ProcessThread::removePid(closePipe[0]);
          String::String((String *)&loop,"Timed out",0xffffffffffffffff);
          std::__cxx11::string::operator=((string *)this_00,(string *)&loop);
          std::__cxx11::string::~string((string *)&loop);
          EVar17 = TimedOut;
          goto LAB_001903c7;
        }
        timeoutForSelect.tv_sec = (__time_t)(iVar4 / 1000);
        timeoutForSelect.tv_usec = (__suseconds_t)((iVar4 % 1000) * 1000);
      }
    }
    std::mutex::lock(&this->mMutex);
    if (this->mSync[1] != -1) {
      __assert_fail("mSync[1] == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Process.cpp"
                    ,0x239,
                    "Process::ExecState Process::startInternal(const Path &, const List<String> &, const List<String> &, int, unsigned int)"
                   );
    }
    handleOutput(this,this->mStdOut[0],&this->mStdOutBuffer,&this->mStdOutIndex,
                 &this->mReadyReadStdOut);
    handleOutput(this,this->mStdErr[0],&this->mStdErrBuffer,&this->mStdErrIndex,
                 &this->mReadyReadStdErr);
    closeStdOut(this);
    closeStdErr(this);
    do {
      iVar4 = close(this->mSync[0]);
      if (iVar4 != -1) break;
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
    this->mSync[0] = -1;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mMutex);
    loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    Signal<std::function<void(Process*)>>::operator()
              ((Signal<std::function<void(Process*)>> *)&this->mFinished,(Process **)&loop);
  }
LAB_001903c7:
  std::vector<String,_std::allocator<String>_>::~vector
            (&arguments.super_vector<String,_std::allocator<String>_>);
LAB_001903d4:
  std::__cxx11::string::~string((string *)&cmd);
  return EVar17;
}

Assistant:

Process::ExecState Process::startInternal(const Path &command, const List<String> &a, const List<String> &environment,
                                          int timeout, unsigned int execFlags)
{
    mErrorString.clear();

    const char *path = 0;
    for (const auto &it : environment) {
        if (it.startsWith("PATH=")) {
            path = it.constData() + 5;
            break;
        }
    }
    Path cmd = findCommand(command, path);
    if (cmd.isEmpty()) {
        mErrorString = "Command not found";
        return Error;
    }
    List<String> arguments = a;
    int err;

    int closePipe[2];
    eintrwrap(err, ::pipe(closePipe));
#ifdef HAVE_CLOEXEC
    if (!SocketClient::setFlags(closePipe[1], FD_CLOEXEC, F_GETFD, F_SETFD)) {
        mErrorString = "Unable to set FD_CLOEXEC";
        eintrwrap(err, ::close(closePipe[0]));
        eintrwrap(err, ::close(closePipe[1]));
        return Error;
    }
#else
#warning No CLOEXEC, Process might have problematic behavior
#endif

    eintrwrap(err, ::pipe(mStdIn));
    eintrwrap(err, ::pipe(mStdOut));
    eintrwrap(err, ::pipe(mStdErr));
    if (mMode == Sync)
        eintrwrap(err, ::pipe(mSync));

    const char **args = new const char*[arguments.size() + 2];
    // const char* args[arguments.size() + 2];
    args[arguments.size() + 1] = 0;
    args[0] = cmd.nullTerminated();
    int pos = 1;
    for (List<String>::const_iterator it = arguments.begin(); it != arguments.end(); ++it) {
        args[pos] = it->nullTerminated();
        // printf("arg: '%s'\n", args[pos]);
        ++pos;
    }

    const bool hasEnviron = !environment.empty();

    const char **env = new const char*[environment.size() + 1];
    env[environment.size()] = 0;

    if (hasEnviron) {
        pos = 0;
        //printf("fork, about to exec '%s'\n", cmd.nullTerminated());
        for (List<String>::const_iterator it = environment.begin(); it != environment.end(); ++it) {
            env[pos] = it->nullTerminated();
            //printf("env: '%s'\n", env[pos]);
            ++pos;
        }
    }

    ProcessThread::setPending(1);

    mPid = ::fork();
    if (mPid == -1) {
        //printf("fork, something horrible has happened %d\n", errno);
        // bail out

        ProcessThread::setPending(-1);

        eintrwrap(err, ::close(mStdIn[1]));
        eintrwrap(err, ::close(mStdIn[0]));
        eintrwrap(err, ::close(mStdOut[1]));
        eintrwrap(err, ::close(mStdOut[0]));
        eintrwrap(err, ::close(mStdErr[1]));
        eintrwrap(err, ::close(mStdErr[0]));
        eintrwrap(err, ::close(closePipe[1]));
        eintrwrap(err, ::close(closePipe[0]));
        mErrorString = "Fork failed";
        delete[] env;
        delete[] args;
        return Error;
    } else if (mPid == 0) {
        //printf("fork, in child\n");
        // child, should do some error checking here really
        eintrwrap(err, ::close(closePipe[0]));
        eintrwrap(err, ::close(mStdIn[1]));
        eintrwrap(err, ::close(mStdOut[0]));
        eintrwrap(err, ::close(mStdErr[0]));

        eintrwrap(err, ::close(STDIN_FILENO));
        eintrwrap(err, ::close(STDOUT_FILENO));
        eintrwrap(err, ::close(STDERR_FILENO));

        eintrwrap(err, ::dup2(mStdIn[0], STDIN_FILENO));
        eintrwrap(err, ::close(mStdIn[0]));
        eintrwrap(err, ::dup2(mStdOut[1], STDOUT_FILENO));
        eintrwrap(err, ::close(mStdOut[1]));
        eintrwrap(err, ::dup2(mStdErr[1], STDERR_FILENO));
        eintrwrap(err, ::close(mStdErr[1]));

        int ret;
        if (!mChRoot.isEmpty() && ::chroot(mChRoot.constData())) {
            goto error;
        }
        if (!mCwd.isEmpty() && ::chdir(mCwd.constData())) {
            goto error;
        }
        if (hasEnviron) {
            ret = ::execve(cmd.nullTerminated(), const_cast<char* const*>(args), const_cast<char* const*>(env));
        } else {
            ret = ::execv(cmd.nullTerminated(), const_cast<char* const*>(args));
        }
        // notify the parent process
  error:
        const char c = 'c';
        eintrwrap(err, ::write(closePipe[1], &c, 1));
        eintrwrap(err, ::close(closePipe[1]));
        ::_exit(1);
        (void)ret;
        //printf("fork, exec seemingly failed %d, %d %s\n", ret, errno, Rct::strerror().constData());
    } else {
        delete[] env;
        delete[] args;

        // parent
        eintrwrap(err, ::close(closePipe[1]));
        eintrwrap(err, ::close(mStdIn[0]));
        eintrwrap(err, ::close(mStdOut[1]));
        eintrwrap(err, ::close(mStdErr[1]));

        //printf("fork, in parent\n");

        int flags;
        eintrwrap(flags, fcntl(mStdIn[1], F_GETFL, 0));
        eintrwrap(flags, fcntl(mStdIn[1], F_SETFL, flags | O_NONBLOCK));
        eintrwrap(flags, fcntl(mStdOut[0], F_GETFL, 0));
        eintrwrap(flags, fcntl(mStdOut[0], F_SETFL, flags | O_NONBLOCK));
        eintrwrap(flags, fcntl(mStdErr[0], F_GETFL, 0));
        eintrwrap(flags, fcntl(mStdErr[0], F_SETFL, flags | O_NONBLOCK));

        // block until exec is called in the child or until exec fails
        {
            char c;
            eintrwrap(err, ::read(closePipe[0], &c, 1));
            (void)c;

            if (err == -1) {
                // bad
                eintrwrap(err, ::close(closePipe[0]));
                mErrorString = "Failed to read from closePipe during process start";
                mPid = -1;
                ProcessThread::setPending(-1);
                mReturn = ReturnCrashed;
                return Error;
            } else if (err == 0) {
                // process has started successfully
                eintrwrap(err, ::close(closePipe[0]));
            } else if (err == 1) {
                // process start failed
                eintrwrap(err, ::close(closePipe[0]));
                mErrorString = "Process failed to start";
                mReturn = ReturnCrashed;
                mPid = -1;
                ProcessThread::setPending(-1);
                return Error;
            }
        }

        ProcessThread::addPid(mPid, this, (mMode == Async));

        //printf("fork, about to add fds: stdin=%d, stdout=%d, stderr=%d\n", mStdIn[1], mStdOut[0], mStdErr[0]);
        if (mMode == Async) {
            if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
                loop->registerSocket(mStdOut[0], EventLoop::SocketRead, std::bind(&Process::processCallback, this, std::placeholders::_1, std::placeholders::_2));
                loop->registerSocket(mStdErr[0], EventLoop::SocketRead, std::bind(&Process::processCallback, this, std::placeholders::_1, std::placeholders::_2));
            }
        } else {
            // select and stuff
            timeval started, now, timeoutForSelect;
            if (timeout > 0) {
                Rct::gettime(&started);
                timeoutForSelect.tv_sec = timeout / 1000;
                timeoutForSelect.tv_usec = (timeout % 1000) * 1000;
            }
            if (!(execFlags & NoCloseStdIn)) {
                closeStdIn(CloseForce);
                mWantStdInClosed = false;
            }
            for (;;) {
                // set up all the select crap
                fd_set rfds, wfds;
                FD_ZERO(&rfds);
                FD_ZERO(&wfds);
                int max = 0;
                FD_SET(mStdOut[0], &rfds);
                max = std::max(max, mStdOut[0]);
                FD_SET(mStdErr[0], &rfds);
                max = std::max(max, mStdErr[0]);
                FD_SET(mSync[0], &rfds);
                max = std::max(max, mSync[0]);
                if (mStdIn[1] != -1) {
                    FD_SET(mStdIn[1], &wfds);
                    max = std::max(max, mStdIn[1]);
                }
                int ret;
                eintrwrap(ret, ::select(max + 1, &rfds, &wfds, 0, timeout > 0 ? &timeoutForSelect : 0));
                if (ret == -1) { // ow
                    mErrorString = "Sync select failed: ";
                    mErrorString += Rct::strerror();
                    return Error;
                }
                // check fds and stuff
                if (FD_ISSET(mStdOut[0], &rfds))
                    handleOutput(mStdOut[0], mStdOutBuffer, mStdOutIndex, mReadyReadStdOut);
                if (FD_ISSET(mStdErr[0], &rfds))
                    handleOutput(mStdErr[0], mStdErrBuffer, mStdErrIndex, mReadyReadStdErr);
                if (mStdIn[1] != -1 && FD_ISSET(mStdIn[1], &wfds))
                    handleInput(mStdIn[1]);
                if (FD_ISSET(mSync[0], &rfds)) {
                    // we're done
                    {
                        std::lock_guard<std::mutex> lock(mMutex);
                        assert(mSync[1] == -1);

                        // try to read all remaining data on stdout and stderr
                        handleOutput(mStdOut[0], mStdOutBuffer, mStdOutIndex, mReadyReadStdOut);
                        handleOutput(mStdErr[0], mStdErrBuffer, mStdErrIndex, mReadyReadStdErr);

                        closeStdOut();
                        closeStdErr();

                        int w;
                        eintrwrap(w, ::close(mSync[0]));
                        mSync[0] = -1;
                    }
                    mFinished(this);
                    return Done;
                }
                if (timeout) {
                    Rct::gettime(&now);

                    // lasted is the amount of time we spent until now in ms
                    const int lasted = Rct::timevalDiff(&now, &started);
                    if (lasted >= timeout) {
                        // timeout, we're done
                        kill(); // attempt to kill

                        // we need to remove this Process object from
                        // ProcessThread, because ProcessThread will try to
                        // finish() this object. However, this object may
                        // already have been deleted *before* ProcessThread
                        // runs, creating a segfault.
                        ProcessThread::removePid(mPid);

                        mErrorString = "Timed out";
                        return TimedOut;
                    }

                    // (timeout - lasted) is guaranteed to be > 0 because of
                    // the check above.
                    timeoutForSelect.tv_sec = (timeout - lasted) / 1000;
                    timeoutForSelect.tv_usec = ((timeout - lasted) % 1000) * 1000;
                }
            }
        }
    }
    return Done;
}